

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

size_t __thiscall rcg::Stream::getNumChunksMax(Stream *this)

{
  unsigned_long uVar1;
  
  std::recursive_mutex::lock(&this->mtx);
  uVar1 = anon_unknown_6::getStreamValue<unsigned_long>(&this->gentl,this->stream,0xb);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return uVar1;
}

Assistant:

size_t Stream::getNumChunksMax()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  return getStreamValue<size_t>(gentl, stream, GenTL::STREAM_INFO_NUM_CHUNKS_MAX);
}